

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001cdea0 = 0x2e2e2e2e2e2e2e;
    uRam00000000001cdea7._0_1_ = '.';
    uRam00000000001cdea7._1_1_ = '.';
    uRam00000000001cdea7._2_1_ = '.';
    uRam00000000001cdea7._3_1_ = '.';
    uRam00000000001cdea7._4_1_ = '.';
    uRam00000000001cdea7._5_1_ = '.';
    uRam00000000001cdea7._6_1_ = '.';
    uRam00000000001cdea7._7_1_ = '.';
    DAT_001cde90 = '.';
    DAT_001cde90_1._0_1_ = '.';
    DAT_001cde90_1._1_1_ = '.';
    DAT_001cde90_1._2_1_ = '.';
    DAT_001cde90_1._3_1_ = '.';
    DAT_001cde90_1._4_1_ = '.';
    DAT_001cde90_1._5_1_ = '.';
    DAT_001cde90_1._6_1_ = '.';
    uRam00000000001cde98 = 0x2e2e2e2e2e2e2e;
    DAT_001cde9f = 0x2e;
    DAT_001cde80 = '.';
    DAT_001cde80_1._0_1_ = '.';
    DAT_001cde80_1._1_1_ = '.';
    DAT_001cde80_1._2_1_ = '.';
    DAT_001cde80_1._3_1_ = '.';
    DAT_001cde80_1._4_1_ = '.';
    DAT_001cde80_1._5_1_ = '.';
    DAT_001cde80_1._6_1_ = '.';
    uRam00000000001cde88._0_1_ = '.';
    uRam00000000001cde88._1_1_ = '.';
    uRam00000000001cde88._2_1_ = '.';
    uRam00000000001cde88._3_1_ = '.';
    uRam00000000001cde88._4_1_ = '.';
    uRam00000000001cde88._5_1_ = '.';
    uRam00000000001cde88._6_1_ = '.';
    uRam00000000001cde88._7_1_ = '.';
    DAT_001cde70 = '.';
    DAT_001cde70_1._0_1_ = '.';
    DAT_001cde70_1._1_1_ = '.';
    DAT_001cde70_1._2_1_ = '.';
    DAT_001cde70_1._3_1_ = '.';
    DAT_001cde70_1._4_1_ = '.';
    DAT_001cde70_1._5_1_ = '.';
    DAT_001cde70_1._6_1_ = '.';
    uRam00000000001cde78._0_1_ = '.';
    uRam00000000001cde78._1_1_ = '.';
    uRam00000000001cde78._2_1_ = '.';
    uRam00000000001cde78._3_1_ = '.';
    uRam00000000001cde78._4_1_ = '.';
    uRam00000000001cde78._5_1_ = '.';
    uRam00000000001cde78._6_1_ = '.';
    uRam00000000001cde78._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001cde68._0_1_ = '.';
    uRam00000000001cde68._1_1_ = '.';
    uRam00000000001cde68._2_1_ = '.';
    uRam00000000001cde68._3_1_ = '.';
    uRam00000000001cde68._4_1_ = '.';
    uRam00000000001cde68._5_1_ = '.';
    uRam00000000001cde68._6_1_ = '.';
    uRam00000000001cde68._7_1_ = '.';
    DAT_001cdeaf = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}